

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int write_hypseg(FILE *fh,ps_decoder_t *ps,char *uttid)

{
  uint local_50;
  uint local_4c;
  int32 wlscr_1;
  int32 ascr_1;
  char *w;
  int32 wlscr;
  int32 wlascr;
  ps_seg_t *itor;
  int32 ef;
  int32 sf;
  int32 lscr;
  int32 ascr;
  char *uttid_local;
  ps_decoder_t *ps_local;
  FILE *fh_local;
  
  _lscr = uttid;
  uttid_local = (char *)ps;
  ps_local = (ps_decoder_t *)fh;
  _wlscr = ps_seg_iter(ps);
  ef = 0;
  sf = 0;
  for (; _wlscr != (ps_seg_t *)0x0; _wlscr = ps_seg_next(_wlscr)) {
    ps_seg_prob(_wlscr,(int32 *)((long)&w + 4),(int32 *)&w,(int32 *)0x0);
    ef = (int)w + ef;
    sf = w._4_4_ + sf;
  }
  fprintf((FILE *)ps_local,"%s S %d T %d A %d L %d",_lscr,0,(ulong)(uint)(sf + ef),(ulong)(uint)sf,
          ef);
  for (_wlscr = ps_seg_iter((ps_decoder_t *)uttid_local); _wlscr != (ps_seg_t *)0x0;
      _wlscr = ps_seg_next(_wlscr)) {
    _wlscr_1 = ps_seg_word(_wlscr);
    ps_seg_prob(_wlscr,(int32 *)&local_4c,(int32 *)&local_50,(int32 *)0x0);
    ps_seg_frames(_wlscr,(int *)((long)&itor + 4),(int *)&itor);
    fprintf((FILE *)ps_local," %d %d %d %s",(ulong)itor._4_4_,(ulong)local_4c,(ulong)local_50,
            _wlscr_1);
  }
  fprintf((FILE *)ps_local," %d\n",(ulong)(uint)itor);
  return 0;
}

Assistant:

static int
write_hypseg(FILE *fh, ps_decoder_t *ps, char const *uttid)
{
    int32 ascr, lscr, sf, ef;
    ps_seg_t *itor = ps_seg_iter(ps);

    /* Accumulate language model scores. */
    lscr = 0; ascr = 0;
    while (itor) {
        int32 wlascr, wlscr;
        ps_seg_prob(itor, &wlascr, &wlscr, NULL);
        lscr += wlscr;
        ascr += wlascr;
        itor = ps_seg_next(itor);
    }
    fprintf(fh, "%s S %d T %d A %d L %d", uttid,
            0, /* "scaling factor" which is mostly useless anyway */
            ascr + lscr, ascr, lscr);
    /* Now print out words. */
    itor = ps_seg_iter(ps);
    while (itor) {
        char const *w = ps_seg_word(itor);
        int32 ascr, wlscr;

        ps_seg_prob(itor, &ascr, &wlscr, NULL);
        ps_seg_frames(itor, &sf, &ef);
        fprintf(fh, " %d %d %d %s", sf, ascr, wlscr, w);
        itor = ps_seg_next(itor);
    }
    fprintf(fh, " %d\n", ef);

    return 0;
}